

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismaticJoint.cpp
# Opt level: O0

Transform * __thiscall
iDynTree::PrismaticJoint::getTransform
          (PrismaticJoint *this,VectorDynSize *jntPos,LinkIndex p_linkA,LinkIndex p_linkB)

{
  ulong uVar1;
  long in_RDX;
  PrismaticJoint *in_RSI;
  long *in_RDI;
  double dist;
  double in_stack_ffffffffffffffb8;
  Transform *local_8;
  
  uVar1 = (**(code **)(*in_RDI + 0xb0))();
  iDynTree::VectorDynSize::operator()((VectorDynSize *)in_RSI,uVar1);
  updateBuffers(in_RSI,in_stack_ffffffffffffffb8);
  if (in_RDX == in_RDI[4]) {
    local_8 = (Transform *)(in_RDI + 0x1f);
  }
  else {
    local_8 = (Transform *)(in_RDI + 0x2b);
  }
  return local_8;
}

Assistant:

const Transform & PrismaticJoint::getTransform(const VectorDynSize& jntPos,
                                              const LinkIndex p_linkA,
                                              const LinkIndex p_linkB) const
{
    const double dist = jntPos(this->getPosCoordsOffset());
    updateBuffers(dist);
    if( p_linkA == link1 )
    {
        assert(p_linkB == link2);
        return this->link1_X_link2;
    }
    else
    {
        assert(p_linkA == link2);
        assert(p_linkB == link1);
        return this->link2_X_link1;
    }
}